

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O1

strbuilder * strbuilder_append_structured_data(strbuilder *builder,stumpless_entry *entry)

{
  stumpless_element *buffer;
  stumpless_param *buffer_00;
  strbuilder *psVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (entry->element_count != 0) {
    if (entry->element_count != 0) {
      uVar2 = 0;
      do {
        buffer = entry->elements[uVar2];
        psVar1 = strbuilder_append_char(builder,'[');
        psVar1 = strbuilder_append_buffer(psVar1,buffer->name,buffer->name_length);
        if (entry->elements[uVar2]->param_count != 0) {
          uVar3 = 0;
          do {
            buffer_00 = buffer->params[uVar3];
            psVar1 = strbuilder_append_char(psVar1,' ');
            psVar1 = strbuilder_append_buffer(psVar1,buffer_00->name,buffer_00->name_length);
            psVar1 = strbuilder_append_char(psVar1,'=');
            psVar1 = strbuilder_append_char(psVar1,'\"');
            psVar1 = strbuilder_append_buffer(psVar1,buffer_00->value,buffer_00->value_length);
            psVar1 = strbuilder_append_char(psVar1,'\"');
            uVar3 = uVar3 + 1;
          } while (uVar3 < entry->elements[uVar2]->param_count);
        }
        builder = strbuilder_append_char(psVar1,']');
        uVar2 = uVar2 + 1;
      } while (uVar2 < entry->element_count);
    }
    return builder;
  }
  psVar1 = strbuilder_append_char(builder,'-');
  return psVar1;
}

Assistant:

struct strbuilder *
strbuilder_append_structured_data( struct strbuilder *builder,
                                   const struct stumpless_entry *entry ) {
  size_t i;
  size_t j;
  const struct stumpless_element *element;
  const struct stumpless_param *param;

  if( entry->element_count == 0 ) {
    return strbuilder_append_char( builder, '-' );
  }

  for( i = 0; i < entry->element_count; i++ ) {
    element = entry->elements[i];

    builder = strbuilder_append_char( builder, '[' );
    builder = strbuilder_append_buffer( builder,
                                        element->name, element->name_length );

    for( j = 0; j < entry->elements[i]->param_count; j++ ) {
      param = element->params[j];

      builder = strbuilder_append_char( builder, ' ' );

      builder = strbuilder_append_buffer( builder,
                                          param->name, param->name_length );

      builder = strbuilder_append_char( builder, '=' );
      builder = strbuilder_append_char( builder, '"' );

      builder = strbuilder_append_buffer( builder,
                                          param->value, param->value_length );

      builder = strbuilder_append_char( builder, '"' );
    }

    builder = strbuilder_append_char( builder, ']' );
  }

  return builder;
}